

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O1

int __thiscall OctetType::fromBuffer(OctetType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  uVar2 = uVar1;
  if ((-1 < (int)uVar1) && (uVar2 = 0xfffffff0, (this->super_BER_CONTAINER)._length < 0x1f5)) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->_value,0,(char *)(this->_value)._M_string_length,(ulong)(buf + uVar1));
    uVar2 = (this->super_BER_CONTAINER)._length + uVar1;
  }
  return uVar2;
}

Assistant:

int OctetType::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;
    if(_length > OCTET_TYPE_MAX_LENGTH) return SNMP_BUFFER_ERROR_OCTET_TOO_BIG;

    _value.assign((char*)ptr, _length);

    return _length + i;
}